

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  char *pcVar1;
  cp_info *constantPool;
  int iVar2;
  MethodArea *this;
  ClassRuntime *this_00;
  ClassFile *pCVar3;
  char *pcVar4;
  long lVar5;
  FILE *__stream;
  ExecutionEngine *this_01;
  size_t sVar6;
  char *__filename;
  string fileName;
  string className;
  undefined1 *local_88;
  size_t local_80;
  undefined1 local_78 [16];
  string local_68;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  if (argc - 4U < 0xfffffffe) {
    puts("Uso:");
    puts("\t./JVM arquivo_class.class \t ou,");
    puts("\t./JVM arquivo_class.class arquivo_saida.txt");
  }
  else {
    pcVar1 = argv[1];
    if (argc < 3) {
      __filename = (char *)0x0;
    }
    else {
      __filename = argv[2];
    }
    this = MethodArea::getInstance();
    std::__cxx11::string::string((string *)&local_68,pcVar1,(allocator *)&local_88);
    this_00 = MethodArea::loadClassNamed(this,&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p);
    }
    pCVar3 = ClassRuntime::getClassFile(this_00);
    constantPool = pCVar3->constant_pool;
    pCVar3 = ClassRuntime::getClassFile(this_00);
    pcVar4 = getFormattedConstant(constantPool,pCVar3->this_class);
    std::__cxx11::string::string((string *)&local_68,pcVar4,(allocator *)&local_88);
    std::__cxx11::string::string((string *)&local_88,pcVar1,(allocator *)local_48);
    lVar5 = std::__cxx11::string::find((char *)&local_88,0x124004,0);
    if (lVar5 != -1) {
      std::__cxx11::string::substr((ulong)local_48,(ulong)&local_88);
      std::__cxx11::string::operator=((string *)&local_88,(string *)local_48);
      if (local_48[0] != local_38) {
        operator_delete(local_48[0]);
      }
    }
    if (local_68._M_string_length == local_80) {
      if (local_68._M_string_length == 0) {
LAB_0010d86d:
        if (__filename == (char *)0x0) {
          this_01 = ExecutionEngine::getInstance();
          ExecutionEngine::startExecutionEngine(this_01,this_00);
        }
        else {
          __stream = fopen(__filename,"w+");
          if (__stream == (FILE *)0x0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Erro ao abrir arquivo ",0x16);
            sVar6 = strlen(__filename);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,__filename,sVar6);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,".",1);
            std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
            exit(2);
          }
          pCVar3 = ClassRuntime::getClassFile(this_00);
          printClassFile(pCVar3,(FILE *)__stream);
          fclose(__stream);
        }
        if (local_88 != local_78) {
          operator_delete(local_88);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p);
        }
        return 0;
      }
      iVar2 = bcmp(local_68._M_dataplus._M_p,local_88,local_68._M_string_length);
      if (iVar2 == 0) goto LAB_0010d86d;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Nome do arquivo diferente do nome da classe.",0x2c);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
  }
  exit(1);
}

Assistant:

int main(int argc, char *argv[]) {
    if (argc < 2 || argc > 3) {
        printf("Uso:\n");
        printf("\t./JVM arquivo_class.class \t ou,\n");
        printf("\t./JVM arquivo_class.class arquivo_saida.txt\n");
        exit(1);
    }
    
	const char *file_className = argv[1];
	const char *file_output = (argc < 3) ? NULL : argv[2];
    
    // Carregamento da classe de entrada.
    MethodArea &methodArea = MethodArea::getInstance();
    ClassRuntime *classRuntime = methodArea.loadClassNamed(file_className);
    // Fim do carregamento.
    
    // Verificação se o nome da classe de entrada é igual ao nome do arquivo.
    string className = getFormattedConstant(classRuntime->getClassFile()->constant_pool, classRuntime->getClassFile()->this_class);
    string fileName(file_className);
    if (fileName.find(".class") != fileName.npos) {
        fileName = fileName.substr(0, fileName.size() - 6);
    }
    if (className != fileName) {
        cerr << "Nome do arquivo diferente do nome da classe." << endl;
        exit(1);
    }
    // Fim da verificação
    
    // Salvando a estrutura do .class em um arquivo de saída ou realizando a execução da classe.
    if (file_output) {
        FILE *output = fopen(file_output, "w+");
        if (output == NULL) {
            cerr << "Erro ao abrir arquivo " << file_output << "." << endl;
            exit(2);
        }
        printClassFile(classRuntime->getClassFile(), output);
        fclose(output);
    } else {
        ExecutionEngine &executionEngine = ExecutionEngine::getInstance();
        executionEngine.startExecutionEngine(classRuntime);
    }
    
    return 0;
}